

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_m2mf.cc
# Opt level: O0

bool __thiscall hwtest::pgraph::anon_unknown_10::MthdM2mfFormat::is_valid_val(MthdM2mfFormat *this)

{
  uint uVar1;
  uint uVar2;
  int b;
  int a;
  MthdM2mfFormat *this_local;
  
  uVar2 = (uint)(((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x3d) >> 0x3d);
  uVar1 = (uint)(((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x35) >> 0x3d);
  if (((uVar2 == 1) || (uVar2 == 2)) || (uVar2 == 4)) {
    if (((uVar1 == 1) || (uVar1 == 2)) || (uVar1 == 4)) {
      if (((this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.super_Test.
           chipset.chipset < 5) ||
         (((this->super_SingleMthdTest).super_MthdTest.val & 0xfffff800) == 0)) {
        this_local._7_1_ = ((this->super_SingleMthdTest).super_MthdTest.val & 0xf8) == 0;
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool is_valid_val() override {
		int a = extr(val, 0, 3);
		int b = extr(val, 8, 3);
		if (a != 1 && a != 2 && a != 4)
			return false;
		if (b != 1 && b != 2 && b != 4)
			return false;
		if (chipset.chipset >= 5 && val & ~0x7ff)
			return false;
		return !(val & 0xf8);
	}